

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall QDockWidgetLayout::setGeometry(QDockWidgetLayout *this,QRect *geometry)

{
  bool bVar1;
  bool bVar2;
  int h;
  uint uVar3;
  QDockWidget *pQVar4;
  reference ppQVar5;
  QStyle *pQVar6;
  undefined8 *in_RSI;
  QStyleOptionDockWidget *in_RDI;
  long in_FS_OFFSET;
  QLayoutItem *item_4;
  QLayoutItem *item_3;
  QLayoutItem *item_2;
  QLayoutItem *item_1;
  int titleHeight;
  QLayoutItem *item;
  int fw;
  bool nativeDeco;
  QDockWidget *q;
  QRect r_2;
  QRect r_1;
  QRect r;
  QStyleOptionDockWidget opt;
  int in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int xpos;
  QLayoutItem *pQVar7;
  QDockWidgetLayout *in_stack_fffffffffffffee0;
  QPoint *in_stack_fffffffffffffee8;
  QRect *in_stack_fffffffffffffef0;
  QDockWidgetLayout *in_stack_ffffffffffffff00;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  QObject *local_98;
  Data *local_90;
  QObject *local_78;
  Data *local_70;
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(&in_stack_fffffffffffffee0->super_QLayout);
  pQVar4 = qobject_cast<QDockWidget*>((QObject *)0x58ba5d);
  bVar1 = nativeWindowDeco(in_stack_fffffffffffffee0);
  bVar2 = QDockWidget::isFloating((QDockWidget *)0x58ba7c);
  if ((!bVar2) || (bVar1)) {
    xpos = 0;
  }
  else {
    pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)
                           );
    xpos = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x12,0,pQVar4);
  }
  if (bVar1) {
    ppQVar5 = QList<QLayoutItem_*>::operator[]
                        ((QList<QLayoutItem_*> *)in_RDI,CONCAT44(xpos,in_stack_fffffffffffffec8));
    pQVar7 = *ppQVar5;
    if (pQVar7 != (QLayoutItem *)0x0) {
      (*pQVar7->_vptr_QLayoutItem[6])(pQVar7,in_RSI);
    }
  }
  else {
    h = QDockWidgetLayout::titleHeight(in_stack_ffffffffffffff00);
    if (((in_RDI->super_QStyleOption).rect.y2.m_i & 1) == 0) {
      QPoint::QPoint((QPoint *)in_RDI,xpos,in_stack_fffffffffffffec8);
      QRect::width((QRect *)CONCAT44(xpos,in_stack_fffffffffffffec8));
      QSize::QSize((QSize *)in_RDI,xpos,in_stack_fffffffffffffec8);
      QRect::QRect(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                   (QSize *)in_stack_fffffffffffffee0);
      (in_RDI->super_QStyleOption).styleObject = local_98;
      (in_RDI->title).d.d = local_90;
    }
    else {
      QPoint::QPoint((QPoint *)in_RDI,xpos,in_stack_fffffffffffffec8);
      QRect::height((QRect *)CONCAT44(xpos,h));
      QSize::QSize((QSize *)in_RDI,xpos,h);
      QRect::QRect(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                   (QSize *)in_stack_fffffffffffffee0);
      (in_RDI->super_QStyleOption).styleObject = local_78;
      (in_RDI->title).d.d = local_70;
      in_stack_fffffffffffffec8 = h;
    }
    ppQVar5 = QList<QLayoutItem_*>::operator[]
                        ((QList<QLayoutItem_*> *)in_RDI,CONCAT44(xpos,in_stack_fffffffffffffec8));
    pQVar7 = *ppQVar5;
    if (pQVar7 == (QLayoutItem *)0x0) {
      memset(local_68,0xaa,0x60);
      QStyleOptionDockWidget::QStyleOptionDockWidget((QStyleOptionDockWidget *)0x58bc6a);
      (**(code **)(*(long *)&pQVar4->super_QWidget + 0x1a0))(pQVar4,local_68);
      ppQVar5 = QList<QLayoutItem_*>::operator[]
                          ((QList<QLayoutItem_*> *)in_RDI,CONCAT44(xpos,in_stack_fffffffffffffec8));
      pQVar7 = *ppQVar5;
      if (pQVar7 != (QLayoutItem *)0x0) {
        uVar3 = (*pQVar7->_vptr_QLayoutItem[8])();
        if ((uVar3 & 1) == 0) {
          local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar6 = QWidget::style((QWidget *)CONCAT44(xpos,in_stack_fffffffffffffec8));
          local_b8._0_16_ = (**(code **)(*(long *)pQVar6 + 0xc0))(pQVar6,0x1c,local_68,pQVar4);
          bVar1 = QRect::isNull((QRect *)in_RDI);
          if (!bVar1) {
            (*pQVar7->_vptr_QLayoutItem[6])(pQVar7,local_b8);
          }
        }
      }
      ppQVar5 = QList<QLayoutItem_*>::operator[]
                          ((QList<QLayoutItem_*> *)in_RDI,CONCAT44(xpos,in_stack_fffffffffffffec8));
      in_stack_fffffffffffffee0 = (QDockWidgetLayout *)*ppQVar5;
      if (in_stack_fffffffffffffee0 != (QDockWidgetLayout *)0x0) {
        uVar3 = (*(*(_func_int ***)&in_stack_fffffffffffffee0->super_QLayout)[8])();
        if ((uVar3 & 1) == 0) {
          local_c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar6 = QWidget::style((QWidget *)CONCAT44(xpos,in_stack_fffffffffffffec8));
          local_c8 = (**(code **)(*(long *)pQVar6 + 0xc0))(pQVar6,0x1d,local_68,pQVar4);
          bVar1 = QRect::isNull((QRect *)in_RDI);
          if (!bVar1) {
            (*(*(_func_int ***)&in_stack_fffffffffffffee0->super_QLayout)[6])
                      (in_stack_fffffffffffffee0,local_c8);
          }
        }
      }
      QStyleOptionDockWidget::~QStyleOptionDockWidget(in_RDI);
    }
    else {
      (*pQVar7->_vptr_QLayoutItem[6])(pQVar7,&(in_RDI->super_QStyleOption).styleObject);
    }
    ppQVar5 = QList<QLayoutItem_*>::operator[]
                        ((QList<QLayoutItem_*> *)in_RDI,CONCAT44(xpos,in_stack_fffffffffffffec8));
    pQVar7 = *ppQVar5;
    if (pQVar7 != (QLayoutItem *)0x0) {
      local_d8 = *in_RSI;
      local_d0 = in_RSI[1];
      if (((in_RDI->super_QStyleOption).rect.y2.m_i & 1) == 0) {
        QRect::bottom((QRect *)0x58be89);
        QRect::setTop((QRect *)in_RDI,xpos);
        QRect::adjust((QRect *)in_stack_fffffffffffffee0,(int)((ulong)pQVar7 >> 0x20),(int)pQVar7,
                      (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      }
      else {
        QRect::right((QRect *)0x58be4c);
        QRect::setLeft((QRect *)in_RDI,xpos);
        QRect::adjust((QRect *)in_stack_fffffffffffffee0,(int)((ulong)pQVar7 >> 0x20),(int)pQVar7,
                      (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      }
      (*pQVar7->_vptr_QLayoutItem[6])(pQVar7,&local_d8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidgetLayout::setGeometry(const QRect &geometry)
{
    QDockWidget *q = qobject_cast<QDockWidget*>(parentWidget());

    bool nativeDeco = nativeWindowDeco();

    int fw = q->isFloating() && !nativeDeco
            ? q->style()->pixelMetric(QStyle::PM_DockWidgetFrameWidth, nullptr, q)
            : 0;

    if (nativeDeco) {
        if (QLayoutItem *item = item_list[Content])
            item->setGeometry(geometry);
    } else {
        int titleHeight = this->titleHeight();

        if (verticalTitleBar) {
            _titleArea = QRect(QPoint(fw, fw),
                                QSize(titleHeight, geometry.height() - (fw * 2)));
        } else {
            _titleArea = QRect(QPoint(fw, fw),
                                QSize(geometry.width() - (fw * 2), titleHeight));
        }

        if (QLayoutItem *item = item_list[TitleBar]) {
            item->setGeometry(_titleArea);
        } else {
            QStyleOptionDockWidget opt;
            q->initStyleOption(&opt);

            if (QLayoutItem *item = item_list[CloseButton]) {
                if (!item->isEmpty()) {
                    QRect r = q->style()
                        ->subElementRect(QStyle::SE_DockWidgetCloseButton,
                                            &opt, q);
                    if (!r.isNull())
                        item->setGeometry(r);
                }
            }

            if (QLayoutItem *item = item_list[FloatButton]) {
                if (!item->isEmpty()) {
                    QRect r = q->style()
                        ->subElementRect(QStyle::SE_DockWidgetFloatButton,
                                            &opt, q);
                    if (!r.isNull())
                        item->setGeometry(r);
                }
            }
        }

        if (QLayoutItem *item = item_list[Content]) {
            QRect r = geometry;
            if (verticalTitleBar) {
                r.setLeft(_titleArea.right() + 1);
                r.adjust(0, fw, -fw, -fw);
            } else {
                r.setTop(_titleArea.bottom() + 1);
                r.adjust(fw, 0, -fw, -fw);
            }
            item->setGeometry(r);
        }
    }
}